

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::operator+(String *lhs,String *rhs)

{
  String *in_RDX;
  String *in_RSI;
  String *in_RDI;
  String *this;
  String *other;
  
  this = in_RDI;
  other = in_RDX;
  String::String(in_RDI,in_RDI);
  String::operator+=(in_RSI,other);
  String::String(this,in_RDI);
  String::~String(in_RDX);
  return this;
}

Assistant:

String operator+(const String& lhs, const String& rhs) { return  String(lhs) += rhs; }